

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O2

bool TdokuMinimize(bool pencilmark,bool monotonic,char *puzzle)

{
  State *this;
  int iVar1;
  byte bVar2;
  size_t sVar3;
  char cVar4;
  size_t limit;
  State *state_00;
  pointer piVar5;
  vector<int,_std::allocator<int>_> permutation;
  State state;
  _Vector_base<int,_std::allocator<int>_> local_438;
  undefined1 local_420 [1008];
  
  Util::Permutation((vector<int,_std::allocator<int>_> *)&local_438,
                    (Util *)((anonymous_namespace)::generator + 0x220),0x2d9);
  this = (State *)(local_420 + 0x1e0);
  bVar2 = 0;
  for (piVar5 = local_438._M_impl.super__Vector_impl_data._M_start;
      piVar5 != local_438._M_impl.super__Vector_impl_data._M_finish; piVar5 = piVar5 + 1) {
    iVar1 = *piVar5;
    if (pencilmark) {
      cVar4 = '.';
      if (puzzle[iVar1] == '.') {
LAB_00104c97:
        anon_unknown.dwarf_d932::State::State(this);
        if (pencilmark) {
          puzzle[iVar1] = (char)(iVar1 % 9) + '1';
          anon_unknown.dwarf_d932::SolverDpllTriadSimd<0>::InitPencilmarkByBox(puzzle,this);
        }
        else {
          puzzle[iVar1] = '.';
          anon_unknown.dwarf_d932::SolverDpllTriadSimd<0>::InitVanillaByBand(puzzle,this);
        }
        state_00 = this;
        anon_unknown.dwarf_d932::State::State((State *)local_420,this);
        sVar3 = anon_unknown.dwarf_d932::SolverDpllTriadSimd<0>::
                SafeCountSolutionsConsistentWithPartialAssignment
                          ((SolverDpllTriadSimd<0> *)local_420,state_00,limit);
        if (sVar3 < 2) {
          if ((monotonic & bVar2) != 0) break;
        }
        else {
          puzzle[iVar1] = cVar4;
          bVar2 = 1;
        }
      }
    }
    else if ((iVar1 < 0x51) && (cVar4 = puzzle[iVar1], cVar4 != '.')) goto LAB_00104c97;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_438);
  return piVar5 == local_438._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool TdokuMinimize(bool pencilmark, bool monotonic, char *puzzle) {
    return generator.Minimize(pencilmark, monotonic, puzzle);
}